

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O0

int __thiscall
btSimpleDynamicsWorld::stepSimulation
          (btSimpleDynamicsWorld *this,btScalar timeStep,int maxSubSteps,btScalar fixedTimeStep)

{
  int iVar1;
  int iVar2;
  int iVar3;
  btDispatcherInfo *pbVar4;
  undefined4 extraout_var;
  btCollisionObjectArray *this_00;
  btCollisionObject **ppbVar5;
  btCollisionWorld *in_RDI;
  btScalar in_XMM0_Da;
  btContactSolverInfo infoGlobal;
  btPersistentManifold **manifoldPtr;
  int numManifolds;
  btDispatcherInfo *dispatchInfo;
  undefined8 in_stack_ffffffffffffff58;
  long *plVar6;
  btSimpleDynamicsWorld *in_stack_ffffffffffffff60;
  undefined1 local_8c [40];
  btScalar in_stack_ffffffffffffff9c;
  btSimpleDynamicsWorld *in_stack_ffffffffffffffa0;
  
  predictUnconstraintMotion
            (in_stack_ffffffffffffff60,(btScalar)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  pbVar4 = btCollisionWorld::getDispatchInfo(in_RDI);
  pbVar4->m_timeStep = in_XMM0_Da;
  pbVar4->m_stepCount = 0;
  iVar1 = (*in_RDI->_vptr_btCollisionWorld[5])();
  pbVar4->m_debugDraw = (btIDebugDraw *)CONCAT44(extraout_var,iVar1);
  (*in_RDI->_vptr_btCollisionWorld[0xb])();
  iVar1 = (*in_RDI->m_dispatcher1->_vptr_btDispatcher[9])();
  if (iVar1 != 0) {
    iVar2 = (*in_RDI->m_dispatcher1->_vptr_btDispatcher[0xb])();
    btContactSolverInfo::btContactSolverInfo((btContactSolverInfo *)local_8c);
    (**(code **)(**(long **)&in_RDI[1].m_forceUpdateAllAabbs + 0x10))
              (*(long **)&in_RDI[1].m_forceUpdateAllAabbs,0,iVar1);
    plVar6 = *(long **)&in_RDI[1].m_forceUpdateAllAabbs;
    this_00 = btCollisionWorld::getCollisionObjectArray(in_RDI);
    ppbVar5 = btAlignedObjectArray<btCollisionObject_*>::operator[](this_00,0);
    iVar3 = btCollisionWorld::getNumCollisionObjects((btCollisionWorld *)0x232ced);
    (**(code **)(*plVar6 + 0x18))
              (plVar6,ppbVar5,iVar3,iVar2,iVar1,0,0,local_8c,in_RDI->m_debugDrawer,
               in_RDI->m_dispatcher1);
    (**(code **)(**(long **)&in_RDI[1].m_forceUpdateAllAabbs + 0x20))
              (*(long **)&in_RDI[1].m_forceUpdateAllAabbs,local_8c,in_RDI->m_debugDrawer);
  }
  integrateTransforms(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  (*in_RDI->_vptr_btCollisionWorld[2])();
  (*in_RDI->_vptr_btCollisionWorld[0x14])();
  (*in_RDI->_vptr_btCollisionWorld[0x1e])();
  return 1;
}

Assistant:

int		btSimpleDynamicsWorld::stepSimulation( btScalar timeStep,int maxSubSteps, btScalar fixedTimeStep)
{
	(void)fixedTimeStep;
	(void)maxSubSteps;


	///apply gravity, predict motion
	predictUnconstraintMotion(timeStep);

	btDispatcherInfo&	dispatchInfo = getDispatchInfo();
	dispatchInfo.m_timeStep = timeStep;
	dispatchInfo.m_stepCount = 0;
	dispatchInfo.m_debugDraw = getDebugDrawer();

	///perform collision detection
	performDiscreteCollisionDetection();

	///solve contact constraints
	int numManifolds = m_dispatcher1->getNumManifolds();
	if (numManifolds)
	{
		btPersistentManifold** manifoldPtr = ((btCollisionDispatcher*)m_dispatcher1)->getInternalManifoldPointer();
		
		btContactSolverInfo infoGlobal;
		infoGlobal.m_timeStep = timeStep;
		m_constraintSolver->prepareSolve(0,numManifolds);
		m_constraintSolver->solveGroup(&getCollisionObjectArray()[0],getNumCollisionObjects(),manifoldPtr, numManifolds,0,0,infoGlobal,m_debugDrawer, m_dispatcher1);
		m_constraintSolver->allSolved(infoGlobal,m_debugDrawer);
	}

	///integrate transforms
	integrateTransforms(timeStep);
		
	updateAabbs();

	synchronizeMotionStates();

	clearForces();

	return 1;

}